

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O2

void leveldb::BM_LogAndApply(int iters,int num_base_files)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Env *pEVar4;
  uint num;
  uint num_00;
  uint num_01;
  ulong uVar5;
  ulong extraout_RDX;
  uint64_t file;
  ulong uVar6;
  leveldb *this;
  ulong uVar7;
  bool bVar8;
  bool save_manifest;
  DB *db;
  ulong local_6a8;
  Status s;
  InternalKey limit;
  InternalKey limit_1;
  InternalKeyComparator cmp;
  Status local_620;
  string local_618;
  string dbname;
  Mutex mu;
  undefined1 local_5a8 [16];
  Writer *pWStack_598;
  VersionEdit vbase;
  VersionSet vset;
  char buf [16];
  Options options;
  Options opts;
  
  test::TmpDir_abi_cxx11_();
  std::operator+(&dbname,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vset,
                 "/leveldb_test_benchmark");
  std::__cxx11::string::~string((string *)&vset);
  Options::Options((Options *)&vset);
  DestroyDB((leveldb *)&local_620,&dbname,(Options *)&vset);
  Status::~Status(&local_620);
  db = (DB *)0x0;
  Options::Options(&opts);
  opts.create_if_missing = true;
  DB::Open((DB *)&s,&opts,&dbname,&db);
  test::Tester::Tester
            ((Tester *)&vset,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x8d5);
  test::Tester::IsOk((Tester *)&vset,&s);
  test::Tester::~Tester((Tester *)&vset);
  test::Tester::Tester
            ((Tester *)&vset,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x8d6);
  test::Tester::Is((Tester *)&vset,db != (DB *)0x0,"db != nullptr");
  test::Tester::~Tester((Tester *)&vset);
  if (db != (DB *)0x0) {
    (*db->_vptr_DB[1])();
  }
  db = (DB *)0x0;
  pEVar4 = Env::Default();
  mu.mu_.super___mutex_base._M_mutex._16_8_ = 0;
  mu.mu_.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  mu.mu_.super___mutex_base._M_mutex.__align = 0;
  mu.mu_.super___mutex_base._M_mutex._8_8_ = 0;
  mu.mu_.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  std::mutex::lock(&mu.mu_);
  cmp.user_comparator_ = BytewiseComparator();
  cmp.super_Comparator._vptr_Comparator = (_func_int **)&PTR__Comparator_001530d0;
  Options::Options(&options);
  VersionSet::VersionSet(&vset,&dbname,&options,(TableCache *)0x0,&cmp);
  test::Tester::Tester
            ((Tester *)buf,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x8e4);
  VersionSet::Recover((VersionSet *)&vbase,(bool *)&vset);
  test::Tester::IsOk((Tester *)buf,(Status *)&vbase);
  Status::~Status((Status *)&vbase);
  test::Tester::~Tester((Tester *)buf);
  VersionEdit::VersionEdit(&vbase);
  uVar7 = 0;
  uVar6 = 0;
  if (0 < num_base_files) {
    uVar6 = (ulong)(uint)num_base_files;
  }
  iVar3 = (int)uVar6;
  local_6a8 = (ulong)(iVar3 + 1);
  if (0 < iters) {
    uVar7 = (ulong)(uint)iters;
  }
  file = 1;
  this = (leveldb *)0x2;
  uVar5 = uVar7;
  while (bVar8 = uVar6 != 0, uVar6 = uVar6 - 1, bVar8) {
    MakeKey_abi_cxx11_(&limit.rep_,this,(uint)uVar5);
    limit_1.rep_._M_dataplus = limit.rep_._M_dataplus;
    limit_1.rep_._M_string_length = limit.rep_._M_string_length;
    InternalKey::InternalKey((InternalKey *)buf,(Slice *)&limit_1.rep_,1,kTypeValue);
    std::__cxx11::string::~string((string *)&limit.rep_);
    MakeKey_abi_cxx11_(&limit_1.rep_,(leveldb *)(ulong)((int)this + 1),num);
    local_618._M_dataplus._M_p = limit_1.rep_._M_dataplus._M_p;
    local_618._M_string_length = limit_1.rep_._M_string_length;
    InternalKey::InternalKey((InternalKey *)&limit.rep_,(Slice *)&local_618,1,kTypeDeletion);
    std::__cxx11::string::~string((string *)&limit_1);
    VersionEdit::AddFile(&vbase,2,file,1,(InternalKey *)buf,(InternalKey *)&limit.rep_);
    file = file + 1;
    std::__cxx11::string::~string((string *)&limit.rep_);
    std::__cxx11::string::~string((string *)buf);
    this = (leveldb *)(ulong)((int)this + 2);
    uVar5 = extraout_RDX;
  }
  test::Tester::Tester
            ((Tester *)buf,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x8ec);
  VersionSet::LogAndApply((VersionSet *)&limit,(VersionEdit *)&vset,(Mutex *)&vbase);
  test::Tester::IsOk((Tester *)buf,(Status *)&limit);
  Status::~Status((Status *)&limit);
  test::Tester::~Tester((Tester *)buf);
  iVar2 = (*pEVar4->_vptr_Env[0x13])();
  uVar1 = iVar3 * 2;
  while( true ) {
    bVar8 = uVar7 == 0;
    uVar7 = uVar7 - 1;
    if (bVar8) break;
    VersionEdit::VersionEdit((VersionEdit *)buf);
    VersionEdit::DeleteFile((VersionEdit *)buf,2,local_6a8);
    MakeKey_abi_cxx11_(&limit_1.rep_,(leveldb *)(ulong)(uVar1 + 2),num_00);
    local_618._M_dataplus._M_p = limit_1.rep_._M_dataplus._M_p;
    local_618._M_string_length = limit_1.rep_._M_string_length;
    InternalKey::InternalKey(&limit,(Slice *)&local_618,1,kTypeValue);
    std::__cxx11::string::~string((string *)&limit_1.rep_);
    MakeKey_abi_cxx11_(&local_618,(leveldb *)(ulong)(uVar1 + 3),num_01);
    local_5a8._8_8_ = local_618._M_dataplus._M_p;
    pWStack_598 = (Writer *)local_618._M_string_length;
    InternalKey::InternalKey((InternalKey *)&limit_1.rep_,(Slice *)(local_5a8 + 8),1,kTypeDeletion);
    std::__cxx11::string::~string((string *)&local_618);
    VersionEdit::AddFile((VersionEdit *)buf,2,local_6a8,1,&limit,&limit_1);
    VersionSet::LogAndApply((VersionSet *)local_5a8,(VersionEdit *)&vset,(Mutex *)buf);
    Status::~Status((Status *)local_5a8);
    std::__cxx11::string::~string((string *)&limit_1);
    std::__cxx11::string::~string((string *)&limit);
    VersionEdit::~VersionEdit((VersionEdit *)buf);
    local_6a8 = local_6a8 + 1;
    uVar1 = uVar1 + 2;
  }
  iVar3 = (*pEVar4->_vptr_Env[0x13])();
  snprintf(buf,0x10,"%d",(ulong)(uint)num_base_files);
  fprintf(_stderr,"BM_LogAndApply/%-6s   %8d iters : %9u us (%7.0f us / iter)\n",
          SUB84((double)((float)(uint)(iVar3 - iVar2) / (float)iters),0),buf,(ulong)(uint)iters,
          (ulong)(uint)(iVar3 - iVar2));
  VersionEdit::~VersionEdit(&vbase);
  VersionSet::~VersionSet(&vset);
  Comparator::~Comparator(&cmp.super_Comparator);
  pthread_mutex_unlock((pthread_mutex_t *)&mu);
  Status::~Status(&s);
  std::__cxx11::string::~string((string *)&dbname);
  return;
}

Assistant:

void BM_LogAndApply(int iters, int num_base_files) {
  std::string dbname = test::TmpDir() + "/leveldb_test_benchmark";
  DestroyDB(dbname, Options());

  DB* db = nullptr;
  Options opts;
  opts.create_if_missing = true;
  Status s = DB::Open(opts, dbname, &db);
  ASSERT_OK(s);
  ASSERT_TRUE(db != nullptr);

  delete db;
  db = nullptr;

  Env* env = Env::Default();

  port::Mutex mu;
  MutexLock l(&mu);

  InternalKeyComparator cmp(BytewiseComparator());
  Options options;
  VersionSet vset(dbname, &options, nullptr, &cmp);
  bool save_manifest;
  ASSERT_OK(vset.Recover(&save_manifest));
  VersionEdit vbase;
  uint64_t fnum = 1;
  for (int i = 0; i < num_base_files; i++) {
    InternalKey start(MakeKey(2 * fnum), 1, kTypeValue);
    InternalKey limit(MakeKey(2 * fnum + 1), 1, kTypeDeletion);
    vbase.AddFile(2, fnum++, 1 /* file size */, start, limit);
  }
  ASSERT_OK(vset.LogAndApply(&vbase, &mu));

  uint64_t start_micros = env->NowMicros();

  for (int i = 0; i < iters; i++) {
    VersionEdit vedit;
    vedit.DeleteFile(2, fnum);
    InternalKey start(MakeKey(2 * fnum), 1, kTypeValue);
    InternalKey limit(MakeKey(2 * fnum + 1), 1, kTypeDeletion);
    vedit.AddFile(2, fnum++, 1 /* file size */, start, limit);
    vset.LogAndApply(&vedit, &mu);
  }
  uint64_t stop_micros = env->NowMicros();
  unsigned int us = stop_micros - start_micros;
  char buf[16];
  snprintf(buf, sizeof(buf), "%d", num_base_files);
  fprintf(stderr,
          "BM_LogAndApply/%-6s   %8d iters : %9u us (%7.0f us / iter)\n", buf,
          iters, us, ((float)us) / iters);
}